

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Vgm_Emu::track_info_(Vgm_Emu *this,track_info_t *out,int param_2)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  byte_ *h;
  
  get_vgm_length((header_t *)(this->super_Vgm_Emu_Impl).data,out);
  pbVar2 = (this->super_Vgm_Emu_Impl).data;
  iVar1 = *(int *)(pbVar2 + 0x14);
  h = pbVar2 + (ulong)(iVar1 - 0x2cU) + 0x40;
  lVar3 = check_gd3_header(h,(long)(this->super_Vgm_Emu_Impl).data_end - (long)h);
  if (lVar3 != 0) {
    parse_gd3(pbVar2 + (ulong)(iVar1 - 0x2cU) + 0x4c,h + ((int)lVar3 + 0xc),out);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Vgm_Emu::track_info_( track_info_t* out, int ) const
{
	get_vgm_length( header(), out );
	
	int size;
	byte const* gd3 = gd3_data( &size );
	if ( gd3 )
		parse_gd3( gd3 + gd3_header_size, gd3 + size, out );
	
	return 0;
}